

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O1

bool ON_IntersectViewFrustumPlane
               (ON_Viewport *vp,ON_PlaneEquation *plane_equation,ON_SimpleArray<ON_3dPoint> *points)

{
  int iVar1;
  ON_SimpleArray<ON_3dPoint> *this;
  bool bVar2;
  ON_3dPoint *pOVar3;
  uint uVar4;
  double *t;
  ON_2dVector *pOVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  double dVar15;
  double dVar16;
  ON_2dVector OVar17;
  ON_3dVector Y;
  ON_3dVector X;
  ON_3dPoint C;
  ON_3dVector Z;
  ON_3dPoint P;
  ON_3dPoint P1;
  ON_3dPoint P0;
  ON_PgonPt ppt;
  ON_3dPoint F [8];
  double v [8];
  ON_Plane plane;
  ON_3dPoint local_7f0;
  ON_SimpleArray<ON_3dPoint> *local_7d8;
  double local_7d0;
  double local_7c8;
  double local_7c0;
  double local_7b8;
  ON_3dPoint local_7b0;
  ON_3dPoint local_798;
  ON_3dVector local_780;
  ON_3dVector local_768;
  ON_3dVector local_750;
  ON_3dVector local_738;
  ON_3dVector local_718;
  ON_3dPoint local_6f8;
  ON_3dVector local_6e0;
  ON_3dPoint local_6c8;
  ON_3dPoint local_6a8;
  ON_3dPoint local_688;
  double local_668;
  double dStack_660;
  double local_658;
  double dStack_650;
  double local_648;
  undefined8 uStack_640;
  ON_3dPoint local_638;
  double local_620;
  double dStack_618;
  double local_610;
  double local_608;
  double dStack_600;
  double local_5f8;
  double local_5f0;
  double dStack_5e8;
  double local_5e0;
  double local_5d8;
  double dStack_5d0;
  double local_5c8;
  double local_5c0;
  double dStack_5b8;
  double local_5b0;
  double local_5a8;
  double dStack_5a0;
  double local_598;
  double local_590;
  double dStack_588;
  double local_580;
  double adStack_578 [8];
  ON_Plane local_538;
  ON_3dPoint local_4b8;
  ON_2dVector OStack_4a0;
  undefined8 uStack_490;
  undefined1 local_488 [24];
  ON_2dVector local_470;
  ulong auStack_460 [4];
  ON_2dVector local_440 [65];
  
  local_6f8.z = (vp->m_CamLoc).z;
  local_6f8.x = (vp->m_CamLoc).x;
  local_6f8.y = (vp->m_CamLoc).y;
  local_718.z = (vp->m_CamX).z;
  local_718.x = (vp->m_CamX).x;
  local_718.y = (vp->m_CamX).y;
  local_738.z = (vp->m_CamY).z;
  local_738.x = (vp->m_CamY).x;
  local_738.y = (vp->m_CamY).y;
  local_538.origin.z = (vp->m_CamZ).z;
  local_538.origin.x = (vp->m_CamZ).x;
  local_538.origin.y = (vp->m_CamZ).y;
  ON_3dVector::operator-(&local_6e0,(ON_3dVector *)&local_538);
  if ((vp->m_bValidCamera == true) && (vp->m_bValidFrustum == true)) {
    dVar15 = vp->m_frus_left;
    local_7d8 = (ON_SimpleArray<ON_3dPoint> *)vp->m_frus_right;
    dVar16 = vp->m_frus_bottom;
    local_7b8 = vp->m_frus_top;
    local_7c0 = vp->m_frus_near;
    local_7c8 = vp->m_frus_far;
    ON_Plane::ON_Plane(&local_538,plane_equation);
    bVar2 = ON_Plane::IsValid(&local_538);
    if (bVar2) {
      if (vp->m_projection == perspective_view) {
        local_7d0 = local_7c8 / local_7c0;
      }
      else {
        local_7d0 = 1.0;
      }
      operator*(&local_750,dVar15,&local_718);
      ON_3dPoint::operator+(&local_7b0,&local_6f8,&local_750);
      operator*(&local_768,dVar16,&local_738);
      ON_3dPoint::operator+(&local_798,&local_7b0,&local_768);
      operator*(&local_780,local_7c0,&local_6e0);
      ON_3dPoint::operator+(&local_7f0,&local_798,&local_780);
      local_638.z = local_7f0.z;
      local_638.x = local_7f0.x;
      local_638.y = local_7f0.y;
      operator*(&local_750,(double)local_7d8,&local_718);
      ON_3dPoint::operator+(&local_7b0,&local_6f8,&local_750);
      operator*(&local_768,dVar16,&local_738);
      ON_3dPoint::operator+(&local_798,&local_7b0,&local_768);
      operator*(&local_780,local_7c0,&local_6e0);
      ON_3dPoint::operator+(&local_7f0,&local_798,&local_780);
      local_610 = local_7f0.z;
      local_620 = local_7f0.x;
      dStack_618 = local_7f0.y;
      operator*(&local_750,(double)local_7d8,&local_718);
      ON_3dPoint::operator+(&local_7b0,&local_6f8,&local_750);
      operator*(&local_768,local_7b8,&local_738);
      ON_3dPoint::operator+(&local_798,&local_7b0,&local_768);
      operator*(&local_780,local_7c0,&local_6e0);
      ON_3dPoint::operator+(&local_7f0,&local_798,&local_780);
      local_5f8 = local_7f0.z;
      local_608 = local_7f0.x;
      dStack_600 = local_7f0.y;
      operator*(&local_750,dVar15,&local_718);
      ON_3dPoint::operator+(&local_7b0,&local_6f8,&local_750);
      operator*(&local_768,local_7b8,&local_738);
      ON_3dPoint::operator+(&local_798,&local_7b0,&local_768);
      operator*(&local_780,local_7c0,&local_6e0);
      ON_3dPoint::operator+(&local_7f0,&local_798,&local_780);
      local_5e0 = local_7f0.z;
      local_5f0 = local_7f0.x;
      dStack_5e8 = local_7f0.y;
      dVar15 = dVar15 * local_7d0;
      operator*(&local_750,dVar15,&local_718);
      ON_3dPoint::operator+(&local_7b0,&local_6f8,&local_750);
      dVar16 = dVar16 * local_7d0;
      operator*(&local_768,dVar16,&local_738);
      ON_3dPoint::operator+(&local_798,&local_7b0,&local_768);
      operator*(&local_780,local_7c8,&local_6e0);
      ON_3dPoint::operator+(&local_7f0,&local_798,&local_780);
      local_5c8 = local_7f0.z;
      local_5d8 = local_7f0.x;
      dStack_5d0 = local_7f0.y;
      local_7d8 = (ON_SimpleArray<ON_3dPoint> *)((double)local_7d8 * local_7d0);
      operator*(&local_750,(double)local_7d8,&local_718);
      ON_3dPoint::operator+(&local_7b0,&local_6f8,&local_750);
      operator*(&local_768,dVar16,&local_738);
      ON_3dPoint::operator+(&local_798,&local_7b0,&local_768);
      operator*(&local_780,local_7c8,&local_6e0);
      ON_3dPoint::operator+(&local_7f0,&local_798,&local_780);
      local_5b0 = local_7f0.z;
      local_5c0 = local_7f0.x;
      dStack_5b8 = local_7f0.y;
      operator*(&local_750,(double)local_7d8,&local_718);
      ON_3dPoint::operator+(&local_7b0,&local_6f8,&local_750);
      local_7b8 = local_7b8 * local_7d0;
      operator*(&local_768,local_7b8,&local_738);
      ON_3dPoint::operator+(&local_798,&local_7b0,&local_768);
      operator*(&local_780,local_7c8,&local_6e0);
      ON_3dPoint::operator+(&local_7f0,&local_798,&local_780);
      local_598 = local_7f0.z;
      local_5a8 = local_7f0.x;
      dStack_5a0 = local_7f0.y;
      operator*(&local_750,dVar15,&local_718);
      ON_3dPoint::operator+(&local_7b0,&local_6f8,&local_750);
      operator*(&local_768,local_7b8,&local_738);
      ON_3dPoint::operator+(&local_798,&local_7b0,&local_768);
      operator*(&local_780,local_7c8,&local_6e0);
      ON_3dPoint::operator+(&local_7f0,&local_798,&local_780);
      pOVar3 = &local_638;
      local_580 = local_7f0.z;
      local_590 = local_7f0.x;
      dStack_588 = local_7f0.y;
      lVar10 = 0;
      local_7d8 = points;
      do {
        dVar15 = ON_PlaneEquation::ValueAt(plane_equation,*pOVar3);
        adStack_578[lVar10] = dVar15;
        lVar10 = lVar10 + 1;
        pOVar3 = pOVar3 + 1;
      } while (lVar10 != 8);
      lVar10 = 0;
      uVar6 = 0;
      do {
        iVar8 = (&DAT_006f8400)[lVar10 * 2];
        dVar15 = adStack_578[iVar8];
        iVar1 = (&DAT_006f8404)[lVar10 * 2];
        dVar16 = adStack_578[iVar1];
        local_688.x = (&local_638)[iVar8].x;
        local_688.y = (&local_638)[iVar8].y;
        local_688.z = (&local_638)[iVar8].z;
        local_6a8.x = (&local_638)[iVar1].x;
        local_6a8.y = (&local_638)[iVar1].y;
        local_6a8.z = (&local_638)[iVar1].z;
        if (((dVar15 <= 0.0) && (0.0 <= dVar16)) || ((0.0 <= dVar15 && (dVar16 <= 0.0)))) {
          if ((dVar15 != dVar16) || (NAN(dVar15) || NAN(dVar16))) {
            dVar16 = dVar16 / (dVar16 - dVar15);
            operator*(&local_798,dVar16,&local_688);
            operator*(&local_7b0,1.0 - dVar16,&local_6a8);
            ON_3dPoint::operator+(&local_7f0,&local_798,&local_7b0);
            local_6c8.z = local_7f0.z;
            local_6c8.x = local_7f0.x;
            local_6c8.y = local_7f0.y;
            iVar8 = 1;
            pOVar3 = &local_6c8;
            uVar4 = uVar6;
          }
          else {
            lVar7 = (long)(int)uVar6;
            (&local_4b8)[lVar7 * 2].z = (&local_638)[iVar8].z;
            dVar15 = (&local_638)[iVar8].y;
            (&local_4b8)[lVar7 * 2].x = (&local_638)[iVar8].x;
            (&local_4b8)[lVar7 * 2].y = dVar15;
            iVar8 = 2;
            pOVar3 = &local_638 + iVar1;
            uVar4 = uVar6 + 1;
          }
          uVar6 = uVar6 + iVar8;
          lVar7 = (long)(int)uVar4;
          (&local_4b8)[lVar7 * 2].z = pOVar3->z;
          dVar15 = pOVar3->y;
          (&local_4b8)[lVar7 * 2].x = pOVar3->x;
          (&local_4b8)[lVar7 * 2].y = dVar15;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0xc);
      if (0 < (int)uVar6) {
        uVar9 = 0;
        t = &OStack_4a0.y;
        iVar8 = 0;
        do {
          pOVar5 = (ON_2dVector *)(t + -1);
          ON_Plane::ClosestPointTo(&local_538,*(ON_3dPoint *)(t + -4),(double *)pOVar5,t);
          this = local_7d8;
          dVar15 = *t;
          dVar16 = (&OStack_4a0)[(long)iVar8 * 3].y;
          if ((dVar15 < dVar16) ||
             (((dVar15 == dVar16 && (!NAN(dVar15) && !NAN(dVar16))) &&
              (pOVar5->x <= (&OStack_4a0)[(long)iVar8 * 3].x &&
               (&OStack_4a0)[(long)iVar8 * 3].x != pOVar5->x)))) {
            iVar8 = (int)uVar9;
          }
          uVar9 = uVar9 + 1;
          t = t + 6;
        } while (uVar6 != uVar9);
        lVar10 = (long)iVar8;
        local_668 = (&local_4b8)[lVar10 * 2].x;
        dStack_660 = (&local_4b8)[lVar10 * 2].y;
        local_658 = (&local_4b8)[lVar10 * 2].z;
        dStack_650 = (&OStack_4a0)[lVar10 * 3].x;
        local_648 = (&OStack_4a0)[lVar10 * 3].y;
        uStack_640 = *(undefined8 *)(local_488 + lVar10 * 0x30 + -8);
        if (iVar8 != 0) {
          (&OStack_4a0)[lVar10 * 3].y = OStack_4a0.y;
          *(undefined8 *)(local_488 + lVar10 * 0x30 + -8) = uStack_490;
          (&local_4b8)[lVar10 * 2].z = local_4b8.z;
          (&OStack_4a0)[lVar10 * 3].x = OStack_4a0.x;
          (&local_4b8)[lVar10 * 2].x = local_4b8.x;
          (&local_4b8)[lVar10 * 2].y = local_4b8.y;
          local_4b8.x = local_668;
          local_4b8.y = dStack_660;
          local_4b8.z = local_658;
          OStack_4a0.x = dStack_650;
          OStack_4a0.y = local_648;
        }
        uStack_490 = 0xffefffffffffffff;
        if (uVar6 != 1) {
          uVar9 = 2;
          if (2 < (int)uVar6) {
            uVar9 = (ulong)uVar6;
          }
          lVar10 = 0;
          do {
            dVar16 = *(double *)((long)auStack_460 + lVar10 + -8) - OStack_4a0.y;
            dVar15 = *(double *)((long)&local_470.x + lVar10) - OStack_4a0.x;
            *(double *)((long)&local_470.x + lVar10) = dVar15;
            *(double *)((long)auStack_460 + lVar10 + -8) = dVar16;
            *(ulong *)((long)auStack_460 + lVar10) =
                 ~-(ulong)(0.0 < dVar16) & 0xffefffffffffffff |
                 (ulong)(-dVar15 / dVar16) & -(ulong)(0.0 < dVar16);
            lVar10 = lVar10 + 0x30;
          } while (uVar9 * 0x30 + -0x30 != lVar10);
        }
        OStack_4a0.x = 0.0;
        OStack_4a0.y = 0.0;
        ON_qsort(local_488,(ulong)(uVar6 - 1),0x30,comparePptAngle);
        ON_SimpleArray<ON_3dPoint>::Append(this,&local_4b8);
        OVar17 = ON_2dVector::operator-(&local_470,&OStack_4a0);
        uVar13 = OVar17.y._0_4_;
        uVar14 = OVar17.y._4_4_;
        uVar11 = OVar17.x._0_4_;
        uVar12 = OVar17.x._4_4_;
        if ((int)uVar6 < 3) {
          uVar6 = 1;
          iVar8 = 0;
        }
        else {
          lVar10 = 0;
          uVar9 = 2;
          pOVar5 = local_440;
          do {
            if ((pOVar5->x - (&OStack_4a0)[(long)(int)lVar10 * 3].x) *
                (double)CONCAT44(uVar14,uVar13) <
                (pOVar5->y - (&OStack_4a0)[(long)(int)lVar10 * 3].y) *
                (double)CONCAT44(uVar12,uVar11)) {
              ON_SimpleArray<ON_3dPoint>::Append(this,(ON_3dPoint *)&pOVar5[-5].y);
              lVar10 = uVar9 - 1;
            }
            iVar8 = (int)lVar10;
            OVar17 = ON_2dVector::operator-(pOVar5,&OStack_4a0 + (long)iVar8 * 3);
            uVar13 = OVar17.y._0_4_;
            uVar14 = OVar17.y._4_4_;
            uVar11 = OVar17.x._0_4_;
            uVar12 = OVar17.x._4_4_;
            uVar9 = uVar9 + 1;
            pOVar5 = pOVar5 + 3;
          } while (uVar6 != uVar9);
          uVar6 = (int)uVar9 - 1;
        }
        if (iVar8 < (int)uVar6) {
          ON_SimpleArray<ON_3dPoint>::Append(this,&local_4b8 + (ulong)uVar6 * 2);
        }
      }
    }
    ON_Plane::~ON_Plane(&local_538);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ON_IntersectViewFrustumPlane( 
    const ON_Viewport& vp,
    const ON_PlaneEquation& plane_equation, 
    ON_SimpleArray<ON_3dPoint>& points 
    )
{

  double left, right, bottom, top, near_dist, far_dist;
  double v[8], v0, v1, s;
  ON_PgonPt ppt, ppt_list[24];
  ON_3dPoint F[8], P0, P1, P;
  ON_2dVector D;
  const ON_3dPoint  C = vp.CameraLocation();
  const ON_3dVector X = vp.CameraX();
  const ON_3dVector Y = vp.CameraY();
  const ON_3dVector Z = -vp.CameraZ();
  int e[12][2] = {{0,1},{1,2},{2,3},{3,0},
                  {4,5},{5,6},{6,7},{7,4},
                  {0,4},{1,5},{2,6},{3,7}};
  int i, i0, i1;
  int ppt_count = 0;

  if ( !vp.IsValidCamera() || !vp.GetFrustum(&left,&right,&bottom,&top,&near_dist,&far_dist) )
    return false;

  const ON_Plane plane(plane_equation);
  if ( !plane.IsValid() )
    return false;

  s = ON::perspective_view == vp.Projection() 
    ? far_dist/near_dist
    : 1.0;
  F[0] = C + left*X  + bottom*Y + near_dist*Z;
  F[1] = C + right*X + bottom*Y + near_dist*Z;
  F[2] = C + right*X + top*Y    + near_dist*Z;
  F[3] = C + left*X  + top*Y    + near_dist*Z;

  F[4] = C + s*left*X  + s*bottom*Y + far_dist*Z;
  F[5] = C + s*right*X + s*bottom*Y + far_dist*Z;
  F[6] = C + s*right*X + s*top*Y    + far_dist*Z;
  F[7] = C + s*left*X  + s*top*Y    + far_dist*Z;

  for ( i = 0; i < 8; i++ )
  {
    v[i] = plane_equation.ValueAt(F[i]);
  }

  for ( i = 0; i < 12; i++ )
  {
    v0 = v[e[i][0]];
    v1 = v[e[i][1]];
    P0 = F[e[i][0]];
    P1 = F[e[i][1]];
    if ( (v0 <= 0.0 && v1 >= 0.0) || (v0 >= 0.0 && v1 <= 0.0) )
    {
      if ( v0 == v1 )
      {
        ppt_list[ppt_count++].m_P = P0;
        ppt_list[ppt_count++].m_P = P1;
      }
      else
      {
        s = v1/(v1-v0);
        P = s*P0 + (1.0-s)*P1;
        ppt_list[ppt_count++].m_P = P;
      }
    }
  }

  if ( ppt_count <= 0 )
    return true; // plane misses frustum

  i0 = 0;
  for ( i = 0; i < ppt_count; i++ )
  {
    plane.ClosestPointTo( ppt_list[i].m_P, &ppt_list[i].m_Q.x, &ppt_list[i].m_Q.y );
    if (     ppt_list[i].m_Q.y < ppt_list[i0].m_Q.y 
         || (ppt_list[i].m_Q.y == ppt_list[i0].m_Q.y && ppt_list[i].m_Q.x < ppt_list[i0].m_Q.x) )
      i0 = i;
  }

  // Use Gram scan to get the convex hull and save it in points[].
  // See http://en.wikipedia.org/wiki/Graham_scan for details.

  // put point with smallest m_Q.y coordinate in ppt_list[0].
  ppt = ppt_list[i0];
  if ( i0 )
  {
    ppt_list[i0] = ppt_list[0];
    ppt_list[0] = ppt;
    i0 = 0;
  }

  // sort points by the angle (ppt_list[i].m_Q = ppt_list[0].m_Q) makes
  // with the positive x axis.  This is the same as sorting them by
  // -cot(angle) = -deltax/deltay.
  ppt_list[0].m_negcotangle = -ON_DBL_MAX; // -cot(0) = - infinity
  for ( i = 1; i < ppt_count; i++ )
  {
    ppt_list[i].m_Q.x -= ppt_list[0].m_Q.x;
    ppt_list[i].m_Q.y -= ppt_list[0].m_Q.y;
    ppt_list[i].m_negcotangle = (0.0 >= ppt_list[i].m_Q.y) ? -ON_DBL_MAX : -ppt_list[i].m_Q.x/ppt_list[i].m_Q.y;
  }
  ppt_list[0].m_Q.x = 0.0;
  ppt_list[0].m_Q.y = 0.0;
  ON_qsort(ppt_list+1,ppt_count-1,sizeof(ppt_list[0]),comparePptAngle);

  points.Append(ppt_list[0].m_P);
  i0 = 0;
  i1 = 1;
  D = ppt_list[i1].m_Q - ppt_list[i0].m_Q;

  for ( i = 2; i < ppt_count; i++ )
  {
    if ( (ppt_list[i].m_Q.y - ppt_list[i0].m_Q.y)*D.x <= (ppt_list[i].m_Q.x - ppt_list[i0].m_Q.x)*D.y )
    {
      // ppt_list[i0], ppt_list[i1], ppt_list[i] is a "right" turn or collinear.
      // Drop ppt_list[i1].
      i1 = i;
    }
    else
    {
      // ppt_list[i0], ppt_list[i1], ppt_list[i] is a "left" turn.
      points.Append(ppt_list[i1].m_P);
      i0 = i1;
      i1 = i;
    }
    D = ppt_list[i1].m_Q - ppt_list[i0].m_Q;
  }

  if ( i1 > i0 )
    points.Append(ppt_list[i1].m_P);

  return true;
}